

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void legendre_associated_normalized(int n,int m,double x,double *cx)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double somx2;
  double r8_pi;
  int mm;
  int i;
  double factor;
  double *cx_local;
  double x_local;
  int m_local;
  int n_local;
  
  if (m < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Input value of M is ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,m);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  but M must be nonnegative.\n");
    exit(1);
  }
  if (n < m) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Input value of M = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,m);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Input value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  but M must be less than or equal to N.\n");
    exit(1);
  }
  if (x < -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  but X must be no less than -1.\n");
    exit(1);
  }
  if (x <= 1.0) {
    for (r8_pi._4_4_ = 0; r8_pi._4_4_ <= m + -1; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
      cx[r8_pi._4_4_] = 0.0;
    }
    cx[m] = 1.0;
    dVar2 = sqrt(-x * x + 1.0);
    _mm = 1.0;
    for (r8_pi._4_4_ = 1; r8_pi._4_4_ <= m; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
      cx[m] = -cx[m] * _mm * dVar2;
      _mm = _mm + 2.0;
    }
    if (m + 1 <= n) {
      cx[m + 1] = x * (double)(m * 2 + 1) * cx[m];
    }
    for (r8_pi._4_4_ = m + 2; r8_pi._0_4_ = m, r8_pi._4_4_ <= n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
      cx[r8_pi._4_4_] =
           ((double)(r8_pi._4_4_ * 2 + -1) * x * cx[r8_pi._4_4_ + -1] +
           (double)((-m - r8_pi._4_4_) + 1) * cx[r8_pi._4_4_ + -2]) / (double)(r8_pi._4_4_ - m);
    }
    for (; r8_pi._0_4_ <= n; r8_pi._0_4_ = r8_pi._0_4_ + 1) {
      dVar2 = r8_factorial(r8_pi._0_4_ - m);
      dVar3 = r8_factorial(r8_pi._0_4_ + m);
      dVar2 = sqrt(((double)(r8_pi._0_4_ * 2 + 1) * dVar2) / (dVar3 * 12.566370614359172));
      cx[r8_pi._0_4_] = cx[r8_pi._0_4_] * dVar2;
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cerr,"  but X must be no more than 1.\n");
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void legendre_associated_normalized ( int n, int m, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED_NORMALIZED: normalized associated Legendre functions.
//
//  Discussion:
//
//    The unnormalized associated Legendre functions P_N^M(X) have
//    the property that
//
//      Integral ( -1 <= X <= 1 ) ( P_N^M(X) )^2 dX
//      = 2 * ( N + M )! / ( ( 2 * N + 1 ) * ( N - M )! )
//
//    By dividing the function by the square root of this term,
//    the normalized associated Legendre functions have norm 1.
//
//    However, we plan to use these functions to build spherical
//    harmonics, so we use a slightly different normalization factor of
//
//      sqrt ( ( ( 2 * N + 1 ) * ( N - M )! ) / ( 4 * pi * ( N + M )! ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the maximum first index of the Legendre
//    function, which must be at least 0.
//
//    Input, int M, the second index of the Legendre function,
//    which must be at least 0, and no greater than N.
//
//    Input, double X, the point at which the function is to be
//    evaluated.  X must satisfy -1 <= X <= 1.
//
//    Output, double CX[N+1], the values of the first N+1 function.
//
{
  double factor;
  int i;
  int mm;
  const double r8_pi = 3.141592653589793;
  double somx2;

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of M is " << m << "\n";
    std::cerr << "  but M must be nonnegative.\n";
    exit ( 1 );
  }

  if ( n < m )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of M = " << m << "\n";
    std::cerr << "  Input value of N = " << n << "\n";
    std::cerr << "  but M must be less than or equal to N.\n";
    exit ( 1 );
  }

  if ( x < -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no less than -1.\n";
    exit ( 1 );
  }

  if ( 1.0 < x )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no more than 1.\n";
    exit ( 1 );
  }

  for ( i = 0; i <= m-1; i++ )
  {
    cx[i] = 0.0;
  }
  cx[m] = 1.0;

  somx2 = sqrt ( 1.0 - x * x );

  factor = 1.0;
  for ( i = 1; i <= m; i++ )
  {
    cx[m] = -cx[m] * factor * somx2;
    factor = factor + 2.0;
  }

  if ( m+1 <= n )
  {
    cx[m+1] = x * double( 2 * m + 1 ) * cx[m];
  }

  for ( i = m+2; i <= n; i++ )
  {
    cx[i] = ( double( 2 * i     - 1 ) * x * cx[i-1] 
            + double(   - i - m + 1 )     * cx[i-2] ) 
            / double(     i - m     );
  }
//
//  Normalization.
//
  for ( mm = m; mm <= n; mm++ )
  {
    factor = sqrt ( ( double( 2 * mm + 1 ) * r8_factorial ( mm - m ) ) 
      / ( 4.0 * r8_pi * r8_factorial ( mm + m ) ) );
    cx[mm] = cx[mm] * factor;
  }

  return;
}